

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

real cnn::logsumexp<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
               (Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *x,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *denom)

{
  bool bVar1;
  CoeffReturnType pfVar2;
  const_iterator this;
  const_iterator row;
  reference puVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  float fVar4;
  uint i_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2_1;
  real z;
  real r;
  uint i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  real m;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Index in_stack_ffffffffffffffa8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffb0;
  float local_3c;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  float local_14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  
  local_10 = in_RSI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RSI,0);
  pfVar2 = Eigen::
           DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
           ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         *)in_stack_ffffffffffffffb0._M_current,in_stack_ffffffffffffffa8,
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_14 = *pfVar2;
  local_20 = local_10;
  local_28._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (in_stack_ffffffffffffff88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator*(&local_28);
    pfVar2 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           *)in_stack_ffffffffffffffb0._M_current,in_stack_ffffffffffffffa8,
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (local_14 < *pfVar2) {
      local_14 = *pfVar2;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_28);
  }
  local_3c = 0.0;
  this = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffff88);
  row = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&stack0xffffffffffffffb0);
    pfVar2 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           *)this._M_current,(Index)row._M_current,
                          CONCAT44(*puVar3,in_stack_ffffffffffffffa0));
    fVar4 = expf(*pfVar2 - local_14);
    local_3c = fVar4 + local_3c;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)&stack0xffffffffffffffb0);
  }
  fVar4 = logf(local_3c);
  return local_14 + fVar4;
}

Assistant:

EIGEN_STRONG_INLINE real logsumexp(const T& x, const vector<unsigned>& denom) {
  real m = x(denom[0],0);
  for (auto i : denom) {
    real r = x(i,0);
    if (r > m) m = r;
  }
  real z = 0;
  for (auto i : denom)
    z += expf(x(i,0) - m);
  return m + logf(z);
}